

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
ft::
vector<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::push_back(vector<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *this,value_type *val)

{
  pointer ppVar1;
  size_type sVar2;
  size_type sVar3;
  size_t __size;
  value_type *local_18;
  value_type *val_local;
  vector<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_local;
  
  local_18 = val;
  val_local = (value_type *)this;
  sVar2 = size(this);
  sVar3 = capacity(this);
  if (sVar3 <= sVar2) {
    sVar2 = capacity(this);
    realloc(this,(void *)(sVar2 << 1),__size);
  }
  get_allocator((vector<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)&stack0xffffffffffffffe7);
  ppVar1 = this->m_data;
  sVar2 = size(this);
  allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::construct((allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               *)&stack0xffffffffffffffe7,ppVar1 + sVar2,local_18);
  allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~allocator((allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                *)&stack0xffffffffffffffe7);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void		push_back(value_type const & val) {
		if (this->size() >= this->capacity())
			this->realloc(this->capacity() * 2);
		this->get_allocator().construct(this->m_data + this->size(), val);
		++this->m_size;
	}